

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# structurally_valid.cc
# Opt level: O2

char * google::protobuf::internal::UTF8CoerceToStructurallyValid
                 (StringPiece *src_str,char *idst,char replace_char)

{
  stringpiece_ssize_type sVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  size_t sVar5;
  char *pcVar6;
  char *pcVar7;
  int iVar8;
  undefined1 local_58 [8];
  StringPiece str2;
  
  pcVar3 = src_str->ptr_;
  sVar1 = src_str->length_;
  iVar2 = UTF8SpnStructurallyValid(src_str);
  iVar8 = (int)sVar1;
  if (iVar2 != iVar8) {
    pcVar7 = pcVar3 + iVar8;
    sVar5 = (size_t)iVar2;
    memmove(idst,pcVar3,sVar5);
    pcVar6 = idst + sVar5;
    for (pcVar4 = pcVar3 + sVar5; pcVar3 = idst, pcVar4 < pcVar7; pcVar4 = pcVar4 + sVar5 + 1) {
      *pcVar6 = replace_char;
      pcVar3 = pcVar4 + 1;
      str2.length_ = (stringpiece_ssize_type)(pcVar6 + 1);
      StringPiece::StringPiece((StringPiece *)local_58,pcVar3,(long)pcVar7 - (long)pcVar3);
      iVar2 = UTF8SpnStructurallyValid((StringPiece *)local_58);
      sVar5 = (size_t)iVar2;
      memmove((void *)str2.length_,pcVar3,sVar5);
      pcVar6 = pcVar6 + sVar5 + 1;
    }
  }
  return pcVar3;
}

Assistant:

char* UTF8CoerceToStructurallyValid(const StringPiece& src_str,
                                    char* idst,
                                    const char replace_char) {
  const char* isrc = src_str.data();
  const int len = src_str.length();
  int n = UTF8SpnStructurallyValid(src_str);
  if (n == len) {               // Normal case -- all is cool, return
    return const_cast<char*>(isrc);
  } else {                      // Unusual case -- copy w/o bad bytes
    const char* src = isrc;
    const char* srclimit = isrc + len;
    char* dst = idst;
    memmove(dst, src, n);       // Copy initial good chunk
    src += n;
    dst += n;
    while (src < srclimit) {    // src points to bogus byte or is off the end
      dst[0] = replace_char;                    // replace one bad byte
      src++;
      dst++;
      StringPiece str2(src, srclimit - src);
      n = UTF8SpnStructurallyValid(str2);       // scan the remainder
      memmove(dst, src, n);                     // copy next good chunk
      src += n;
      dst += n;
    }
  }
  return idst;
}